

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

bool UTF_u_to_u8<(char)63>(UTF_US16 *us16,UTF_US8 *us8)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  UTF_UC8 uc8 [4];
  UTF_UC16 uc16 [2];
  UTF_US8 *us8_local;
  UTF_US16 *us16_local;
  
  __gnu_cxx::
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::__normal_iterator(&end);
  local_38._M_current =
       (char16_t *)
       std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
       end(us16);
  end = std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::begin(us16);
  do {
    bVar1 = __gnu_cxx::operator!=(&end,&local_38);
    if (!bVar1) {
      return true;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
             ::operator*(&end);
    bVar1 = UTF_uc16_is_surrogate_high(*pcVar2);
    if (bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator*(&end);
      it._M_current._4_2_ = *pcVar2;
      __gnu_cxx::
      __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
      ::operator++(&end);
      bVar1 = __gnu_cxx::operator==(&end,&local_38);
      if (bVar1) {
        std::__cxx11::
        basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
        ::push_back(us8,'?');
        return true;
      }
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator*(&end);
      it._M_current._6_2_ = *pcVar2;
    }
    else {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator*(&end);
      it._M_current._4_2_ = *pcVar2;
      it._M_current._6_2_ = L'\0';
    }
    bVar1 = UTF_uc16_to_uc8((UTF_UC16 *)((long)&it._M_current + 4),(UTF_UC8 *)&it);
    if (bVar1) {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      push_back(us8,(uchar)it._M_current);
      if (((it._M_current._1_1_ != '\0') &&
          (std::__cxx11::
           basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
           ::push_back(us8,it._M_current._1_1_), it._M_current._2_1_ != '\0')) &&
         (std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::push_back(us8,it._M_current._2_1_), it._M_current._3_1_ != '\0')) {
        std::__cxx11::
        basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
        ::push_back(us8,it._M_current._3_1_);
      }
    }
    else {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      push_back(us8,'?');
    }
    __gnu_cxx::
    __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

inline bool
UTF_u_to_u8(const UTF_US16& us16, UTF_US8& us8)
{
    UTF_UC16 uc16[2];
    UTF_UC8 uc8[4];
    UTF_US16::const_iterator it, end = us16.end();
    for (it = us16.begin(); it != end; ++it)
    {
        if (UTF_uc16_is_surrogate_high(*it))
        {
            uc16[0] = *it;
            ++it;
            if (it == end)
            {
                if (!t_default_char)
                    return false;

                us8.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
                return true;
            }

            uc16[1] = *it;
        }
        else
        {
            uc16[0] = *it;
            uc16[1] = 0;
        }

        if (!UTF_uc16_to_uc8(uc16, uc8))
        {
            if (!t_default_char)
                return false;

            us8.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        us8.push_back(uc8[0]);
        if (uc8[1])
        {
            us8.push_back(uc8[1]);
            if (uc8[2])
            {
                us8.push_back(uc8[2]);
                if (uc8[3])
                {
                    us8.push_back(uc8[3]);
                }
            }
        }
    }

    return true;
}